

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

bool __thiscall
icu_63::number::impl::DecimalQuantity::fitsInLong(DecimalQuantity *this,bool ignoreFraction)

{
  uint uVar1;
  int8_t *piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  
  uVar1 = this->precision;
  bVar3 = true;
  if ((ulong)uVar1 != 0) {
    iVar5 = this->scale;
    if (iVar5 < 0 && !ignoreFraction) {
      return false;
    }
    iVar4 = uVar1 + iVar5 + -1;
    if (0x11 < iVar4) {
      if (iVar4 != 0x12) {
        return false;
      }
      if (0 < (int)uVar1) {
        piVar2 = (this->fBCD).bcdBytes.ptr;
        uVar6 = 0x12 - iVar5;
        iVar5 = iVar5 * -4 + 0x48;
        uVar7 = 0;
        do {
          if (this->usingBytes == false) {
            if (0xf < uVar6) goto LAB_0020f08e;
            bVar8 = (byte)((ulong)piVar2 >> ((byte)iVar5 & 0x3f)) & 0xf;
          }
          else if (uVar6 < uVar1) {
            bVar8 = piVar2[uVar6];
          }
          else {
LAB_0020f08e:
            bVar8 = 0;
          }
          if (bVar8 != "\t\x02\x02\x03\x03\a\x02"[uVar7]) {
            return (char)bVar8 < "\t\x02\x02\x03\x03\a\x02"[uVar7];
          }
          uVar7 = uVar7 + 1;
          uVar6 = uVar6 - 1;
          iVar5 = iVar5 + -4;
        } while (uVar1 != uVar7);
      }
      bVar3 = (bool)(this->flags & 1);
    }
  }
  return bVar3;
}

Assistant:

bool DecimalQuantity::isZero() const {
    return precision == 0;
}